

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::setEnabled(QMdiSubWindowPrivate *this,WindowStateAction action,bool enable)

{
  Data *pDVar1;
  QObject *pQVar2;
  
  pDVar1 = this->actions[action].wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = this->actions[action].wp.value, pQVar2 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar2,0));
    return;
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setEnabled(WindowStateAction action, bool enable)
{
    if (actions[action])
        actions[action]->setEnabled(enable);
}